

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opaque.c
# Opt level: O3

exr_result_t
exr_attr_opaquedata_set_unpacked
          (exr_context_t ctxt,exr_attr_opaquedata_t *u,void *unpacked,int32_t sz)

{
  exr_result_t eVar1;
  
  if (ctxt == (exr_context_t)0x0) {
    eVar1 = 2;
  }
  else {
    if (u == (exr_attr_opaquedata_t *)0x0) {
      eVar1 = (*ctxt->standard_error)(ctxt,3);
      return eVar1;
    }
    if (sz < 0) {
      eVar1 = (*ctxt->print_error)
                        (ctxt,3,"Opaque data given invalid negative size (%d)",(ulong)(uint)sz,
                         ctxt->print_error);
      return eVar1;
    }
    if ((u->unpacked_data != (void *)0x0) &&
       (u->destroy_unpacked_func_ptr != (_func_void_exr_context_t_void_ptr_int32_t *)0x0)) {
      (*u->destroy_unpacked_func_ptr)(ctxt,u->unpacked_data,u->unpacked_size);
    }
    u->unpacked_data = unpacked;
    u->unpacked_size = sz;
    if (u->packed_data == (void *)0x0) {
      eVar1 = 0;
    }
    else {
      if (0 < u->packed_alloc_size) {
        (*ctxt->free_fn)(u->packed_data);
      }
      u->packed_data = (void *)0x0;
      eVar1 = 0;
      u->size = 0;
      u->packed_alloc_size = 0;
    }
  }
  return eVar1;
}

Assistant:

exr_result_t
exr_attr_opaquedata_set_unpacked (
    exr_context_t ctxt, exr_attr_opaquedata_t* u, void* unpacked, int32_t sz)
{
    if (!ctxt) return EXR_ERR_MISSING_CONTEXT_ARG;

    if (!u) return ctxt->standard_error (ctxt, EXR_ERR_INVALID_ARGUMENT);

    /* TODO: do we care if the incoming unpacked data is null? */
    if (sz < 0)
        return ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Opaque data given invalid negative size (%d)",
            sz);

    if (u->unpacked_data)
    {
        if (u->destroy_unpacked_func_ptr)
            u->destroy_unpacked_func_ptr (
                ctxt, u->unpacked_data, u->unpacked_size);
    }
    u->unpacked_data = unpacked;
    u->unpacked_size = sz;

    if (u->packed_data)
    {
        if (u->packed_alloc_size > 0) ctxt->free_fn (u->packed_data);
        u->packed_data       = NULL;
        u->size              = 0;
        u->packed_alloc_size = 0;
    }
    return EXR_ERR_SUCCESS;
}